

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeLateCustomSections(WasmBinaryWriter *this)

{
  pointer pCVar1;
  bool bVar2;
  CustomSection *section;
  pointer section_00;
  
  pCVar1 = (this->wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (section_00 = (this->wasm->customSections).
                    super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                    _M_impl.super__Vector_impl_data._M_start; section_00 != pCVar1;
      section_00 = section_00 + 1) {
    bVar2 = std::operator!=(&section_00->name,BinaryConsts::CustomSections::Dylink);
    if (bVar2) {
      writeCustomSection(this,section_00);
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeLateCustomSections() {
  for (auto& section : wasm->customSections) {
    if (section.name != BinaryConsts::CustomSections::Dylink) {
      writeCustomSection(section);
    }
  }
}